

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O1

FName CommandDrawSwitchableImage::LookupKeySpecies(int keynum)

{
  PClassActor *pPVar1;
  int iVar2;
  ulong uVar3;
  int *in_RDI;
  ulong uVar4;
  PClassActor *pPVar5;
  bool bVar6;
  
  uVar3 = (ulong)PClassActor::AllActorClasses.Count;
  bVar6 = uVar3 != 0;
  if (bVar6) {
    uVar4 = 0;
    do {
      pPVar1 = PClassActor::AllActorClasses.Array[uVar4];
      pPVar5 = pPVar1;
      if (pPVar1 == (PClassActor *)AKey::RegistrationInfo.MyClass) {
LAB_005f9dfb:
        if ((uint)(pPVar1->super_PClass).Defaults[0x4dc] == keynum) {
          if (bVar6) {
            iVar2 = (pPVar1->super_PClass).super_PStruct.super_PNamedType.TypeName.Index;
            goto LAB_005f9e2c;
          }
          break;
        }
      }
      else {
        do {
          pPVar5 = (PClassActor *)(pPVar5->super_PClass).ParentClass;
          if (pPVar5 == (PClassActor *)AKey::RegistrationInfo.MyClass) break;
        } while (pPVar5 != (PClassActor *)0x0);
        if (pPVar5 != (PClassActor *)0x0) goto LAB_005f9dfb;
      }
      uVar4 = uVar4 + 1;
      bVar6 = uVar4 < uVar3;
    } while (uVar4 != uVar3);
  }
  iVar2 = 0;
LAB_005f9e2c:
  *in_RDI = iVar2;
  return (FName)(int)in_RDI;
}

Assistant:

static FName LookupKeySpecies(int keynum)
		{
			for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
			{
				PClassActor *cls = PClassActor::AllActorClasses[i];
				if (cls->IsDescendantOf(RUNTIME_CLASS(AKey)))
				{
					AKey *key = (AKey *)GetDefaultByType(cls);
					if (key->KeyNumber == keynum)
						return cls->TypeName;
				}
			}
			return NAME_None;
		}